

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __type _Var1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  void *__cp;
  ssize_t sVar5;
  long lVar6;
  int local_310;
  allocator local_309;
  string local_308 [48];
  string local_2d8 [8];
  string sUserInput;
  pollfd local_2b8;
  pollfd pollData [2];
  char userInput [256];
  char s [46];
  addrinfo *paStack_168;
  int rv;
  addrinfo *p;
  addrinfo *servinfo;
  addrinfo hints;
  char buf [256];
  int local_1c;
  int numbytes;
  int sockfd;
  char **argv_local;
  int argc_local;
  
  if (argc != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"usage: client hostname");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  memset(&servinfo,0,0x30);
  servinfo._4_4_ = 0;
  hints.ai_flags = 1;
  iVar2 = getaddrinfo(argv[1],"3491",(addrinfo *)&servinfo,(addrinfo **)&p);
  if (iVar2 == 0) {
    for (paStack_168 = p; paStack_168 != (addrinfo *)0x0; paStack_168 = paStack_168->ai_next) {
      local_1c = socket(paStack_168->ai_family,paStack_168->ai_socktype,paStack_168->ai_protocol);
      if (local_1c == -1) {
        perror("client: socket");
      }
      else {
        iVar2 = connect(local_1c,(sockaddr *)paStack_168->ai_addr,paStack_168->ai_addrlen);
        if (iVar2 != -1) break;
        close(local_1c);
        perror("client: connect");
      }
    }
    if (paStack_168 == (addrinfo *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"client: failed to connect");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 2;
    }
    else {
      iVar2 = paStack_168->ai_family;
      __cp = get_in_addr(paStack_168->ai_addr);
      inet_ntop(iVar2,__cp,userInput + 0xf8,0x2e);
      freeaddrinfo((addrinfo *)p);
      poVar3 = std::operator<<((ostream *)&std::cout,"My chat room server. Version Two.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_2b8.fd = local_1c;
      local_2b8.events = 1;
      pollData[0].fd = fileno(_stdin);
      pollData[0].events = 1;
      do {
        while( true ) {
          do {
            while (iVar2 = poll(&local_2b8,2,500), iVar2 == -1) {
              perror("Polling error");
            }
          } while (iVar2 == 0);
          if ((local_2b8.revents & 1U) == 0) break;
          bzero(&hints.ai_next,0x100);
          sVar5 = recv(local_1c,&hints.ai_next,0xff,0);
          iVar2 = (int)sVar5;
          if (iVar2 == -1) {
            perror("recv");
            exit(1);
          }
          buf[(long)iVar2 + -8] = '\0';
          if (0 < iVar2) {
            poVar3 = std::operator<<((ostream *)&std::cout,(char *)&hints.ai_next);
            poVar3 = (ostream *)
                     std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            std::operator<<(poVar3,"> ");
            std::ostream::flush();
          }
        }
        std::__cxx11::string::string(local_2d8);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,local_2d8);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        strcpy((char *)(pollData + 1),pcVar4);
        sVar5 = send(local_1c,pollData + 1,0x100,0);
        if (sVar5 == -1) {
          perror("send");
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_308,"logout",&local_309);
        _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2d8,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_308);
        std::__cxx11::string::~string(local_308);
        std::allocator<char>::~allocator((allocator<char> *)&local_309);
        if (_Var1) {
          local_310 = 6;
        }
        else {
          lVar6 = std::__cxx11::string::find((char *)local_2d8,0x10309f);
          if (lVar6 != -1) {
            std::operator<<((ostream *)&std::cout,"> ");
            std::ostream::flush();
          }
          local_310 = 0;
        }
        std::__cxx11::string::~string(local_2d8);
      } while (local_310 == 0);
      close(local_1c);
      argv_local._4_4_ = 0;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"getaddrinfo: ");
    pcVar4 = gai_strerror(iVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]){
    //lots of declaration with the socket code
    int sockfd, numbytes;
    char buf[MAXDATASIZE];
    struct addrinfo hints, *servinfo, *p;
    int rv;
    char s[INET6_ADDRSTRLEN];
    char userInput[MAXDATASIZE];
    struct pollfd pollData[2];


    if (argc != 2) {
        cerr << "usage: client hostname" << endl;
        exit(1);
    }

    memset(&hints, 0, sizeof hints);

    //Accpets both IPV4 and IPV6
    hints.ai_family = AF_UNSPEC;
    //Using the stream socket type
    hints.ai_socktype = SOCK_STREAM;

    if ((rv = getaddrinfo(argv[1], PORT, &hints, &servinfo)) != 0) {
        cerr << "getaddrinfo: " <<  gai_strerror(rv) << endl;
        return 1;
    }

    // loop through all the results and connect to the first we can
    for(p = servinfo; p != NULL; p = p->ai_next) {
        if ((sockfd = socket(p->ai_family, p->ai_socktype,
                p->ai_protocol)) == -1) {
            perror("client: socket");
            continue;
        }
        //connect to that socket
        if (connect(sockfd, p->ai_addr, p->ai_addrlen) == -1) {
            close(sockfd);
            perror("client: connect");
            continue;
        }

        break;
    }

    if (p == NULL) {
        cerr << "client: failed to connect" << endl;
        return 2;
    }

    //Convert the binary address to string, Thanks to http://beej.us/guide/bgnet/output/html/multipage/clientserver.html
    // for the awsome function with all the bit operators, you da best
    inet_ntop(p->ai_family, get_in_addr((struct sockaddr *)p->ai_addr),
            s, sizeof s);
    //cout << "client: connecting to " <<  s << endl;

    freeaddrinfo(servinfo); // all done with this structure
    cout << "My chat room server. Version Two." << endl;




    //set everything up for stdin and sockect recv polling
    pollData[0].fd = sockfd;
    pollData[0].events = POLLIN;
    pollData[1].fd = fileno(stdin);
    pollData[1].events = POLLIN;


    while(1){

        //TODO finish polling
        rv = poll(pollData, 2, 500);

        if(rv == -1){
            perror("Polling error");
        }
        //check if there was some data recieved on stdin or the socket
        else if (rv != 0){
            //check if it was received on the socket
            if (pollData[0].revents & POLLIN) {
                bzero(buf,MAXDATASIZE);
                if ((numbytes = recv(sockfd, buf, MAXDATASIZE-1, 0)) == -1) {
                    perror("recv");
                    exit(1);
                }

                //add the nul terminator to stop the string of data
                buf[numbytes] = '\0';

                //if recieved actual data print it otherwise ignore it
                if(numbytes > 0){
                    //print out the message received from the serveer
                    cout << buf << endl << "> ";
                    //the last > gets caught if you don't flush standard out
                    cout.flush();
                }
            }
            else{
                // check if the user is typing on the command line
                string sUserInput;
                getline(cin,sUserInput);

                //copy it to a cstring
                strcpy (userInput, sUserInput.c_str());

                //send the input to the server
                if (send(sockfd, userInput, MAXDATASIZE, 0) == -1)
                    perror("send");
                //check if the user wants to log out
                if(sUserInput == string("logout")){
                    break;
                }
                //use this to fixed a missing > for the output
                else if(sUserInput.find("send") !=  string::npos){
                    cout << "> ";
                    cout.flush();
                }
            }
        }

    }

    //close the socket
    close(sockfd);

    return 0;
}